

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind.cc
# Opt level: O1

bool __thiscall
absl::lts_20240722::str_format_internal::anon_unknown_3::ArgContext::Bind
          (ArgContext *this,UnboundConversion *unbound,BoundConversion *bound)

{
  UnboundConversion *p;
  byte bVar1;
  pointer pFVar2;
  char *pcVar3;
  char *pcVar4;
  bool bVar5;
  bool bVar6;
  undefined8 in_RAX;
  pointer pFVar7;
  void *pvVar8;
  uint uVar9;
  pointer pFVar10;
  int *next_arg;
  long extraout_RDX;
  code *pcVar11;
  undefined8 extraout_RDX_00;
  size_t extraout_RDX_01;
  code *extraout_RDX_03;
  undefined8 unaff_RBP;
  Data DVar12;
  pointer pFVar13;
  UnboundConversion *end;
  char *pcVar14;
  byte bVar15;
  char *pcVar16;
  UnboundConversion *__s;
  char *pcVar17;
  string_view v;
  string_view v_00;
  string_view v_01;
  string_view v_02;
  string_view conv_string;
  string_view conv_string_00;
  string_view conv_string_01;
  int width;
  int precision;
  int iStack_4dc;
  Data DStack_4d8;
  UnboundConversion UStack_4d0;
  ConverterConsumer<absl::lts_20240722::str_format_internal::(anonymous_namespace)::SummarizingConverter>
  CStack_4c0;
  undefined1 *puStack_4a8;
  undefined8 uStack_4a0;
  undefined1 uStack_498;
  undefined7 uStack_497;
  undefined8 uStack_490;
  FormatSinkImpl FStack_488;
  BoundConversion *pBStack_68;
  pointer pFStack_60;
  pointer pFStack_58;
  UnboundConversion *pUStack_50;
  ArgContext *pAStack_48;
  code *pcStack_40;
  uint local_38;
  uint local_34;
  code *extraout_RDX_02;
  
  pFVar13 = (pointer)((long)unbound->arg_position - 1);
  pFVar10 = (pointer)(this->pack_).len_;
  if (pFVar10 <= pFVar13) {
    return false;
  }
  pFVar2 = (this->pack_).ptr_;
  if (unbound->flags == kBasic) {
    (bound->super_FormatConversionSpecImpl).flags_ = kBasic;
    (bound->super_FormatConversionSpecImpl).width_ = -1;
    (bound->super_FormatConversionSpecImpl).precision_ = -1;
    goto LAB_0010a52a;
  }
  local_38 = (unbound->width).value_;
  local_34 = (uint)((ulong)in_RAX >> 0x20);
  __s = unbound;
  DVar12 = (Data)this;
  if (-2 < (int)local_38) {
LAB_0010a4b6:
    unaff_RBP = 0;
LAB_0010a4b8:
    local_34 = (unbound->precision).value_;
    if ((int)local_34 < -1) {
      pFVar10 = (pointer)(this->pack_).len_;
      if (pFVar10 < (pointer)(ulong)~local_34) {
        return false;
      }
      pFVar7 = (pointer)((long)&((pointer)(ulong)~local_34)[-1].dispatcher_ + 7);
      if (pFVar10 <= pFVar7) goto LAB_0010a56b;
      pFVar10 = (this->pack_).ptr_;
      pcStack_40 = (code *)0x10a4f8;
      bVar5 = (*pFVar10[(long)pFVar7].dispatcher_)
                        (pFVar10[(long)pFVar7].data_,(FormatConversionSpecImpl)ZEXT812(0x90013),
                         &local_34);
      if (!bVar5) {
        return false;
      }
    }
    (bound->super_FormatConversionSpecImpl).width_ = local_38;
    (bound->super_FormatConversionSpecImpl).precision_ = local_34;
    (bound->super_FormatConversionSpecImpl).flags_ = (Flags)unaff_RBP | unbound->flags;
    (bound->super_FormatConversionSpecImpl).length_mod_ = unbound->length_mod;
LAB_0010a52a:
    (bound->super_FormatConversionSpecImpl).conv_ = unbound->conv;
    bound->arg_ = pFVar2 + (long)pFVar13;
    return true;
  }
  if (pFVar10 < (pointer)(ulong)~local_38) {
    return false;
  }
  pFVar7 = (pointer)((long)&((pointer)(ulong)~local_38)[-1].dispatcher_ + 7);
  if (pFVar7 < pFVar10) {
    DVar12 = pFVar2[(long)pFVar7].data_;
    pcStack_40 = (code *)0x10a4a7;
    __s = (UnboundConversion *)0x90013;
    bVar5 = (*pFVar2[(long)pFVar7].dispatcher_)
                      (DVar12,(FormatConversionSpecImpl)ZEXT812(0x90013),&local_38);
    if (!bVar5) {
      return false;
    }
    if (-1 < (int)local_38) goto LAB_0010a4b6;
    uVar9 = 0x80000001;
    if (-0x7fffffff < (int)local_38) {
      uVar9 = local_38;
    }
    local_38 = -uVar9;
    unaff_RBP = CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
    goto LAB_0010a4b8;
  }
  pcStack_40 = (code *)0x10a56b;
  _GLOBAL__N_1::ArgContext::Bind();
LAB_0010a56b:
  pcStack_40 = Summarize_abi_cxx11_;
  _GLOBAL__N_1::ArgContext::Bind();
  puStack_4a8 = &uStack_498;
  uStack_4a0 = 0;
  uStack_498 = 0;
  FStack_488.raw_.sink_ = &puStack_4a8;
  FStack_488.pos_ = FStack_488.buf_;
  pcVar11 = FormatRawSinkImpl::Flush<std::__cxx11::string>;
  FStack_488.raw_.write_ = FormatRawSinkImpl::Flush<std::__cxx11::string>;
  FStack_488.size_ = 0;
  CStack_4c0.converter_.sink_ = &FStack_488;
  CStack_4c0.arg_context_.pack_.ptr_ = pFVar10;
  pBStack_68 = bound;
  pFStack_60 = pFVar13;
  pFStack_58 = pFVar2;
  pUStack_50 = unbound;
  pAStack_48 = this;
  pcStack_40 = (code *)unaff_RBP;
  if (extraout_RDX == -1) {
    pcVar16 = *(char **)(__s + 1);
    pcVar3 = *(char **)&__s[1].precision;
    DStack_4d8 = DVar12;
    if (pcVar16 != pcVar3) {
      pcVar4 = *(char **)&__s->precision;
      pcVar17 = (char *)0x0;
      pcVar14 = pcVar4;
      do {
        pcVar14 = pcVar14 + (long)pcVar17;
        pcVar17 = pcVar4 + (*(long *)(pcVar16 + 8) - (long)pcVar14);
        if (*pcVar16 == '\x01') {
          conv_string_01._M_str = (char *)pFVar10;
          conv_string_01._M_len = (size_t)pcVar11;
          bVar5 = ConverterConsumer<absl::lts_20240722::str_format_internal::(anonymous_namespace)::SummarizingConverter>
                  ::ConvertOne(&CStack_4c0,(UnboundConversion *)(pcVar16 + 0x10),conv_string_01);
          pcVar11 = extraout_RDX_02;
          if (!bVar5) {
            bVar15 = 0;
            DVar12 = DStack_4d8;
            goto LAB_0010a7e5;
          }
        }
        else {
          v_02._M_str = pcVar14;
          v_02._M_len = (size_t)pcVar17;
          FormatSinkImpl::Append(CStack_4c0.converter_.sink_,v_02);
          pcVar11 = extraout_RDX_03;
        }
        pcVar16 = pcVar16 + 0x20;
      } while (pcVar16 != pcVar3);
    }
    bVar15 = (byte)__s->arg_position ^ 1;
    DVar12 = DStack_4d8;
  }
  else {
    iStack_4dc = 0;
    bVar15 = 1;
    if (extraout_RDX != 0) {
      end = (UnboundConversion *)((long)&__s->arg_position + extraout_RDX);
      DStack_4d8 = DVar12;
      do {
        pvVar8 = memchr(__s,0x25,(long)end - (long)__s);
        if (pvVar8 == (void *)0x0) {
          v_00._M_str = (char *)__s;
          v_00._M_len = (long)end - (long)__s;
          FormatSinkImpl::Append(CStack_4c0.converter_.sink_,v_00);
          bVar5 = true;
          bVar15 = 1;
        }
        else {
          v._M_len = (long)pvVar8 - (long)__s;
          v._M_str = (char *)__s;
          FormatSinkImpl::Append(CStack_4c0.converter_.sink_,v);
          p = (UnboundConversion *)((long)pvVar8 + 1);
          bVar5 = true;
          if (p < end) {
            bVar1 = (byte)p->arg_position;
            if ((char)ConvTagHolder::value[bVar1].tag_ < '\0') {
              if (bVar1 == 0x25) {
                v_01._M_str = "%";
                v_01._M_len = 1;
                FormatSinkImpl::Append(CStack_4c0.converter_.sink_,v_01);
                __s = (UnboundConversion *)((long)pvVar8 + 2);
                bVar5 = false;
              }
              else {
                UStack_4d0.width.value_ = -1;
                UStack_4d0.precision.value_ = -1;
                UStack_4d0.flags = kBasic;
                UStack_4d0.length_mod = none;
                UStack_4d0.conv = 0x13;
                next_arg = &iStack_4dc;
                __s = (UnboundConversion *)
                      ConsumeUnboundConversionNoInline((char *)p,(char *)end,&UStack_4d0,next_arg);
                if (__s == (UnboundConversion *)0x0) {
                  bVar15 = 0;
                  bVar6 = false;
                }
                else {
                  conv_string_00._M_str = (char *)next_arg;
                  conv_string_00._M_len = extraout_RDX_01;
                  bVar6 = ConverterConsumer<absl::lts_20240722::str_format_internal::(anonymous_namespace)::SummarizingConverter>
                          ::ConvertOne(&CStack_4c0,&UStack_4d0,conv_string_00);
                  bVar15 = bVar15 & bVar6;
                }
                if (bVar6 != false) goto LAB_0010a72a;
              }
            }
            else {
              if (iStack_4dc < 0) goto LAB_0010a745;
              UStack_4d0.width.value_ = -1;
              UStack_4d0.precision.value_ = -1;
              UStack_4d0.flags = kBasic;
              UStack_4d0.length_mod = none;
              conv_string._M_str._0_4_ = iStack_4dc + 1;
              conv_string._M_len = extraout_RDX_00;
              conv_string._M_str._4_4_ = 0;
              iStack_4dc = (int)conv_string._M_str;
              UStack_4d0.arg_position = (int)conv_string._M_str;
              UStack_4d0.conv = ConvTagHolder::value[bVar1].tag_;
              bVar6 = ConverterConsumer<absl::lts_20240722::str_format_internal::(anonymous_namespace)::SummarizingConverter>
                      ::ConvertOne(&CStack_4c0,&UStack_4d0,conv_string);
              __s = (UnboundConversion *)((long)pvVar8 + 2);
              bVar15 = bVar15 & bVar6;
              if (bVar6) {
LAB_0010a72a:
                bVar5 = false;
              }
            }
          }
          else {
LAB_0010a745:
            bVar15 = 0;
          }
        }
        DVar12 = DStack_4d8;
        if (bVar5) goto LAB_0010a7e5;
      } while (__s != end);
      bVar15 = 1;
    }
  }
LAB_0010a7e5:
  if ((bVar15 & 1) == 0) {
    *(long *)DVar12.ptr = (long)DVar12.ptr + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)DVar12.ptr,"");
    FormatSinkImpl::~FormatSinkImpl(&FStack_488);
    if ((bVar15 & 1) == 0) goto LAB_0010a861;
  }
  else {
    FormatSinkImpl::~FormatSinkImpl(&FStack_488);
  }
  *(undefined8 **)DVar12.ptr = (undefined8 *)((long)DVar12.ptr + 0x10);
  if (puStack_4a8 == &uStack_498) {
    *(undefined8 *)((long)DVar12.ptr + 0x10) = CONCAT71(uStack_497,uStack_498);
    *(undefined8 *)((long)DVar12.ptr + 0x18) = uStack_490;
  }
  else {
    *(undefined1 **)DVar12.ptr = puStack_4a8;
    *(ulong *)((long)DVar12.ptr + 0x10) = CONCAT71(uStack_497,uStack_498);
  }
  *(undefined8 *)((long)DVar12.ptr + 8) = uStack_4a0;
  uStack_4a0 = 0;
  uStack_498 = 0;
  puStack_4a8 = &uStack_498;
LAB_0010a861:
  if (puStack_4a8 != &uStack_498) {
    operator_delete(puStack_4a8,CONCAT71(uStack_497,uStack_498) + 1);
  }
  return DVar12.buf[0];
}

Assistant:

inline bool ArgContext::Bind(const UnboundConversion* unbound,
                             BoundConversion* bound) {
  const FormatArgImpl* arg = nullptr;
  int arg_position = unbound->arg_position;
  if (static_cast<size_t>(arg_position - 1) >= pack_.size()) return false;
  arg = &pack_[static_cast<size_t>(arg_position - 1)];  // 1-based

  if (unbound->flags != Flags::kBasic) {
    int width = unbound->width.value();
    bool force_left = false;
    if (unbound->width.is_from_arg()) {
      if (!BindFromPosition(unbound->width.get_from_arg(), &width, pack_))
        return false;
      if (width < 0) {
        // "A negative field width is taken as a '-' flag followed by a
        // positive field width."
        force_left = true;
        // Make sure we don't overflow the width when negating it.
        width = -std::max(width, -std::numeric_limits<int>::max());
      }
    }

    int precision = unbound->precision.value();
    if (unbound->precision.is_from_arg()) {
      if (!BindFromPosition(unbound->precision.get_from_arg(), &precision,
                            pack_))
        return false;
    }

    FormatConversionSpecImplFriend::SetWidth(width, bound);
    FormatConversionSpecImplFriend::SetPrecision(precision, bound);

    if (force_left) {
      FormatConversionSpecImplFriend::SetFlags(unbound->flags | Flags::kLeft,
                                               bound);
    } else {
      FormatConversionSpecImplFriend::SetFlags(unbound->flags, bound);
    }

    FormatConversionSpecImplFriend::SetLengthMod(unbound->length_mod, bound);
  } else {
    FormatConversionSpecImplFriend::SetFlags(unbound->flags, bound);
    FormatConversionSpecImplFriend::SetWidth(-1, bound);
    FormatConversionSpecImplFriend::SetPrecision(-1, bound);
  }
  FormatConversionSpecImplFriend::SetConversionChar(unbound->conv, bound);
  bound->set_arg(arg);
  return true;
}